

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O0

int adl_removeBank(ADL_MIDIPlayer *device,ADL_Bank *bank)

{
  iterator it_00;
  OPL3 *pOVar1;
  size_t sVar2;
  size_t sVar3;
  size_t size;
  iterator it;
  BankMap *map;
  MidiPlayer *play;
  ADL_Bank *bank_local;
  ADL_MIDIPlayer *device_local;
  
  if ((device == (ADL_MIDIPlayer *)0x0) || (bank == (ADL_Bank *)0x0)) {
    device_local._4_4_ = -1;
  }
  else {
    if (device->adl_midiPlayer == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x142,"int adl_removeBank(ADL_MIDIPlayer *, ADL_Bank *)");
    }
    pOVar1 = AdlMIDI_UPtr<OPL3,_ADLMIDI_DefaultDelete<OPL3>_>::operator->
                       ((AdlMIDI_UPtr<OPL3,_ADLMIDI_DefaultDelete<OPL3>_> *)
                        ((long)device->adl_midiPlayer + 0x198));
    it.index = (size_t)&pOVar1->m_insBanks;
    BasicBankMap<OPL3::Bank>::iterator::from_ptrs((iterator *)&size,bank->pointer);
    sVar2 = BasicBankMap<OPL3::Bank>::size((BasicBankMap<OPL3::Bank> *)it.index);
    it_00.slot = (Slot *)it.buckets;
    it_00.buckets = (Slot **)size;
    it_00.index = (size_t)it.slot;
    BasicBankMap<OPL3::Bank>::erase((BasicBankMap<OPL3::Bank> *)it.index,it_00);
    sVar3 = BasicBankMap<OPL3::Bank>::size((BasicBankMap<OPL3::Bank> *)it.index);
    device_local._4_4_ = -1;
    if (sVar3 != sVar2) {
      device_local._4_4_ = 0;
    }
  }
  return device_local._4_4_;
}

Assistant:

ADLMIDI_EXPORT int adl_removeBank(ADL_MIDIPlayer *device, ADL_Bank *bank)
{
    if(!device || !bank)
        return -1;

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    Synth::BankMap &map = play->m_synth->m_insBanks;
    Synth::BankMap::iterator it = Synth::BankMap::iterator::from_ptrs(bank->pointer);
    size_t size = map.size();
    map.erase(it);
    return (map.size() != size) ? 0 : -1;
}